

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relation.hpp
# Opt level: O3

string * __thiscall
duckdb::CreateRelationAlias
          (string *__return_storage_ptr__,duckdb *this,RelationType type,string *alias)

{
  string *extraout_RAX;
  char *pcVar1;
  string *extraout_RAX_00;
  string *extraout_RAX_01;
  string *psVar2;
  undefined7 in_register_00000011;
  idx_t length;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  allocator local_79;
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  string local_58;
  string local_38;
  
  if (alias != (string *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,CONCAT71(in_register_00000011,type),
               (long)&(alias->_M_dataplus)._M_p + CONCAT71(in_register_00000011,type));
    return extraout_RAX;
  }
  local_78[0] = local_68;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"%s_%s","");
  pcVar1 = EnumUtil::ToChars<duckdb::RelationType>((RelationType)this);
  ::std::__cxx11::string::string((string *)&local_38,pcVar1,&local_79);
  StringUtil::GenerateRandomName_abi_cxx11_(&local_58,(StringUtil *)0x10,length);
  StringUtil::Format<std::__cxx11::string,std::__cxx11::string>
            (__return_storage_ptr__,(StringUtil *)local_78,&local_38,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_58,in_R8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  psVar2 = (string *)&local_38.field_2;
  if ((string *)local_38._M_dataplus._M_p != psVar2) {
    operator_delete(local_38._M_dataplus._M_p);
    psVar2 = extraout_RAX_00;
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0]);
    psVar2 = extraout_RAX_01;
  }
  return psVar2;
}

Assistant:

static string CreateRelationAlias(RelationType type, const string &alias) {
	if (!alias.empty()) {
		return alias;
	}
	return StringUtil::Format("%s_%s", EnumUtil::ToString(type), StringUtil::GenerateRandomName());
}